

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  float *out_g;
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  undefined1 __src [8];
  ImDrawList *pIVar3;
  uint uVar4;
  ImU32 col_upr_right;
  ImU32 IVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX;
  char *text_end;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  char cVar9;
  ImVec2 *out_r;
  byte bVar10;
  ImGuiContext *g;
  bool bVar11;
  uint uVar12;
  float fVar13;
  int iVar14;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  ImVec2 IVar15;
  int iVar16;
  undefined4 extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  ImVec2 p_min;
  ImVec2 pos;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  int iVar17;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  int iVar18;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  float fVar19;
  float fVar20;
  ImVec2 p_max;
  ImVec2 gradient_p1;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 half_sz_00;
  uint uVar27;
  uint uVar28;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar29;
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float local_22c;
  float local_228;
  float V;
  uint local_220;
  float local_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  undefined8 uStack_200;
  ImVec2 *local_1f0;
  float B;
  float G;
  float R;
  ImVec2 current_off_unrotated;
  float afStack_1d0 [4];
  ImDrawList *local_1c0;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  ImVec2 local_1a8;
  uint local_19c;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  char local_188;
  float vv;
  float fStack_164;
  ImVec2 local_160;
  ImVec2 local_158;
  undefined8 uStack_150;
  float uu;
  float fStack_144;
  ImVec2 local_140;
  float local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  ImVec2 picker_pos;
  float ww;
  float fStack_104;
  ImU32 local_fc;
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  size_t local_c8;
  ImGuiWindow *local_c0;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  float local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float backup_initial_col [4];
  ImVec2 uv_white;
  ImVec2 trc;
  ImVec2 trb;
  undefined1 auVar22 [16];
  
  pIVar2 = GImGui;
  uStack_200 = local_208;
  local_208 = (undefined1  [8])ref_col;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems != false) {
    bVar10 = 0;
    goto LAB_0017d0bf;
  }
  local_1c0 = pIVar1->DrawList;
  local_1f0 = (ImVec2 *)col;
  local_218._0_4_ = CalcItemWidth();
  local_218._4_4_ = extraout_XMM0_Db;
  fStack_210 = (float)extraout_XMM0_Dc;
  fStack_20c = (float)extraout_XMM0_Dd;
  (pIVar2->NextItemData).Flags = 0;
  PushID(label);
  BeginGroup();
  uVar8 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(&local_1f0->x,uVar8);
  }
  if ((flags & 0x6000000U) == 0) {
    uVar4 = pIVar2->ColorEditOptions & 0x6000000;
    uVar12 = 0x2000000;
    if (uVar4 != 0) {
      uVar12 = uVar4;
    }
    uVar8 = uVar8 | uVar12;
  }
  if ((uVar8 & 0x18000000) == 0) {
    uVar4 = pIVar2->ColorEditOptions & 0x18000000;
    uVar12 = 0x8000000;
    if (uVar4 != 0) {
      uVar12 = uVar4;
    }
    uVar8 = uVar8 | uVar12;
  }
  uVar12 = (uVar8 & 0x6000000) - 1;
  if ((uVar8 & 0x6000000 ^ uVar12) <= uVar12) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                  ,0x115d,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  uVar12 = (uVar8 & 0x18000000) - 1;
  if ((uVar8 & 0x18000000 ^ uVar12) <= uVar12) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                  ,0x115e,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  if ((uVar8 & 8) == 0) {
    uVar8 = uVar8 | pIVar2->ColorEditOptions & 0x10000U;
  }
  local_19c = uVar8 & 0x10002;
  bVar11 = local_19c == 0x10000;
  IVar15 = (pIVar1->DC).CursorPos;
  picker_pos = IVar15;
  local_c0 = pIVar1;
  local_138 = GetFrameHeight();
  out_r = local_1f0;
  fVar13 = (pIVar2->Style).ItemInnerSpacing.x;
  fVar29 = (float)local_218._0_4_ - (local_138 + fVar13) * (float)(byte)(bVar11 + 1);
  uVar12 = -(uint)(fVar29 <= local_138);
  uVar4 = local_218._4_4_ & extraout_XMM0_Db_00;
  uVar27 = (uint)fStack_210 & extraout_XMM0_Dc_00;
  uVar28 = (uint)fStack_20c & extraout_XMM0_Dd_00;
  fVar19 = (float)(uVar12 & (uint)local_138 | ~uVar12 & (uint)fVar29);
  local_c8 = (ulong)((uVar8 & 2) == 0) * 4 + 0xc;
  uStack_134 = extraout_XMM0_Db_00;
  uStack_130 = extraout_XMM0_Dc_00;
  uStack_12c = extraout_XMM0_Dd_00;
  memcpy(backup_initial_col,local_1f0,local_c8);
  local_21c = fVar19 * 0.08;
  local_a8 = ZEXT416((uint)(fVar19 * 0.5));
  fVar20 = fVar19 * 0.5 - local_21c;
  _local_d8 = ZEXT416((uint)fVar20);
  local_68 = IVar15.x;
  local_78 = fVar19 + local_68;
  _local_218 = ZEXT416((uint)(fVar13 + local_78));
  uStack_150 = 0;
  fVar31 = (local_138 + fVar19) * 0.5 + local_68;
  fVar29 = fVar19 * 0.5 + IVar15.y;
  triangle_pa.x = fVar20 - (float)(int)(fVar19 * 0.027);
  triangle_pa.y = 0.0;
  local_160.x = triangle_pa.x * -0.5;
  local_160.y = triangle_pa.x * -0.866025;
  triangle_pc.y = triangle_pa.x * 0.866025;
  local_22c = out_r->x;
  local_228 = out_r->y;
  V = out_r[1].x;
  B = V;
  G = local_228;
  R = local_22c;
  local_1a8.x = fVar31;
  local_1a8.y = fVar29;
  triangle_pc.x = local_160.x;
  local_158 = IVar15;
  uStack_74 = uVar4;
  uStack_70 = uVar27;
  uStack_6c = uVar28;
  if ((uVar8 >> 0x1b & 1) == 0) {
    if ((uVar8 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB(local_22c,local_228,V,&R,&G,&B);
    }
  }
  else {
    ColorConvertRGBtoHSV(local_22c,local_228,V,&local_22c,&local_228,&V);
  }
  local_1b8._4_4_ = uStack_134;
  local_1b8._0_4_ = local_138 + (float)local_218._0_4_;
  fStack_1b0 = (float)uStack_130;
  fStack_1ac = (float)uStack_12c;
  PushItemFlag(8,true);
  local_98._4_4_ = local_158.y;
  local_98._0_4_ = local_158.y;
  fStack_90 = local_158.y;
  fStack_8c = local_158.y;
  local_e8 = local_158.y;
  fStack_e4 = local_158.y;
  fStack_e0 = local_158.y;
  fStack_dc = local_158.y;
  if ((uVar8 >> 0x1a & 1) == 0) {
    if ((uVar8 >> 0x19 & 1) == 0) {
      uVar12 = 0;
      local_220 = 0;
      uVar7 = 0;
    }
    else {
      current_off_unrotated.y = fVar19;
      current_off_unrotated.x = fVar19;
      InvisibleButton("sv",&current_off_unrotated);
      bVar11 = IsItemActive();
      if (bVar11) {
        auVar21._0_4_ = fVar19 + -1.0;
        IVar15 = (pIVar2->IO).MousePos;
        auVar32._0_4_ = IVar15.x - local_158.x;
        auVar32._4_4_ = IVar15.y - local_158.y;
        auVar32._8_4_ = 0.0 - (float)uStack_150;
        auVar32._12_4_ = 0.0 - uStack_150._4_4_;
        auVar21._4_4_ = auVar21._0_4_;
        auVar21._8_4_ = auVar21._0_4_;
        auVar21._12_4_ = auVar21._0_4_;
        auVar32 = divps(auVar32,auVar21);
        fVar29 = auVar32._0_4_;
        fVar20 = auVar32._4_4_;
        iVar14 = -(uint)(1.0 < fVar29);
        iVar16 = -(uint)(1.0 < fVar20);
        auVar23._4_4_ = iVar16;
        auVar23._0_4_ = iVar14;
        auVar23._8_4_ = iVar16;
        auVar23._12_4_ = iVar16;
        auVar22._8_8_ = auVar23._8_8_;
        auVar22._4_4_ = iVar14;
        auVar22._0_4_ = iVar14;
        uVar12 = movmskpd((int)CONCAT71(extraout_var,bVar11),auVar22);
        local_228 = 1.0;
        if ((uVar12 & 1) == 0) {
          local_228 = fVar29;
        }
        local_228 = (float)(~-(uint)(fVar29 < 0.0) & (uint)local_228);
        fVar29 = 0.0;
        if ((uVar12 & 2) == 0) {
          fVar29 = 1.0 - fVar20;
        }
        V = (float)(-(uint)(fVar20 < 0.0) & 0x3f800000 | ~-(uint)(fVar20 < 0.0) & (uint)fVar29);
        uVar12 = (uint)CONCAT71((uint7)(uint3)(uVar12 >> 8),1);
      }
      else {
        uVar12 = 0;
      }
      if ((uVar8 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      current_off_unrotated.y = (float)local_98._0_4_;
      current_off_unrotated.x = (float)local_218._0_4_;
      SetCursorScreenPos(&current_off_unrotated);
      current_off_unrotated.y = fVar19;
      current_off_unrotated.x = local_138;
      InvisibleButton("hue",&current_off_unrotated);
      bVar11 = IsItemActive();
      if (bVar11) {
        fVar29 = ((pIVar2->IO).MousePos.y - local_e8) / (fVar19 + -1.0);
        local_22c = 1.0;
        if (fVar29 <= 1.0) {
          local_22c = fVar29;
        }
        local_22c = (float)(~-(uint)(fVar29 < 0.0) & (uint)local_22c);
        local_220 = (uint)CONCAT71(extraout_var_00,1);
        uVar7 = 1;
      }
      else {
        local_220 = 0;
        uVar7 = (ulong)uVar12;
      }
    }
  }
  else {
    current_off_unrotated.y = fVar19;
    current_off_unrotated.x = (pIVar2->Style).ItemInnerSpacing.x + fVar19 + local_138;
    InvisibleButton("hsv",&current_off_unrotated);
    bVar11 = IsItemActive();
    if (bVar11) {
      fVar34 = (pIVar2->IO).MouseClickedPos[0].x - fVar31;
      fVar20 = (pIVar2->IO).MouseClickedPos[0].y - fVar29;
      fVar31 = (pIVar2->IO).MousePos.x - fVar31;
      local_88 = ZEXT416((uint)fVar31);
      fVar29 = (pIVar2->IO).MousePos.y - fVar29;
      local_f8 = ZEXT416((uint)fVar29);
      _local_b8 = ZEXT416((uint)fVar20);
      fVar20 = fVar34 * fVar34 + fVar20 * fVar20;
      if ((fVar20 < ((float)local_d8._0_4_ + -1.0) * ((float)local_d8._0_4_ + -1.0)) ||
         (((float)local_a8._0_4_ + 1.0) * ((float)local_a8._0_4_ + 1.0) < fVar20)) {
        local_220 = 0;
      }
      else {
        fVar29 = atan2f(fVar29,fVar31);
        fVar29 = (fVar29 / 3.1415927) * 0.5;
        local_22c = (float)(~-(uint)(fVar29 < 0.0) & (uint)fVar29 |
                           (uint)(fVar29 + 1.0) & -(uint)(fVar29 < 0.0));
        local_220 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      local_158.x = cosf(local_22c * -2.0 * 3.1415927);
      local_158.y = extraout_XMM0_Db_01;
      uStack_150 = CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01);
      fVar29 = sinf(local_22c * -2.0 * 3.1415927);
      current_off_unrotated.y = fVar29 * fVar34 + local_158.x * (float)local_b8._0_4_;
      current_off_unrotated.x = local_158.x * fVar34 + -(float)local_b8._0_4_ * fVar29;
      bVar11 = ImTriangleContainsPoint(&triangle_pa,&local_160,&triangle_pc,&current_off_unrotated);
      if (bVar11) {
        current_off_unrotated.x =
             local_158.x * (float)local_88._0_4_ + -(float)local_f8._0_4_ * fVar29;
        current_off_unrotated.y =
             fVar29 * (float)local_88._0_4_ + local_158.x * (float)local_f8._0_4_;
        bVar11 = ImTriangleContainsPoint
                           (&triangle_pa,&local_160,&triangle_pc,&current_off_unrotated);
        if (!bVar11) {
          current_off_unrotated =
               ImTriangleClosestPoint(&triangle_pa,&local_160,&triangle_pc,&current_off_unrotated);
        }
        ImTriangleBarycentricCoords
                  (&triangle_pa,&local_160,&triangle_pc,&current_off_unrotated,&uu,&vv,&ww);
        fVar20 = 1.0 - vv;
        fVar29 = 1.0;
        if (fVar20 <= 1.0) {
          fVar29 = fVar20;
        }
        V = (float)(-(uint)(fVar20 < 0.0001) & 0x38d1b717 | ~-(uint)(fVar20 < 0.0001) & (uint)fVar29
                   );
        fVar20 = uu / V;
        fVar29 = 1.0;
        if (fVar20 <= 1.0) {
          fVar29 = fVar20;
        }
        local_228 = (float)(-(uint)(fVar20 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar20 < 0.0001) & (uint)fVar29);
        uVar12 = 1;
        uVar7 = CONCAT71((int7)((ulong)&vv >> 8),1);
      }
      else {
        uVar12 = 0;
        uVar7 = (ulong)local_220;
      }
    }
    else {
      uVar12 = 0;
      local_220 = 0;
      uVar7 = 0;
    }
    if ((uVar8 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  fVar13 = fVar13 + (float)local_1b8._0_4_;
  if (local_19c == 0x10000) {
    current_off_unrotated.y = (float)local_98._0_4_;
    current_off_unrotated.x = fVar13;
    SetCursorScreenPos(&current_off_unrotated);
    current_off_unrotated.y = fVar19;
    current_off_unrotated.x = local_138;
    InvisibleButton("alpha",&current_off_unrotated);
    bVar11 = IsItemActive();
    if (bVar11) {
      fVar20 = ((pIVar2->IO).MousePos.y - local_e8) / (fVar19 + -1.0);
      fVar29 = 1.0;
      if (fVar20 <= 1.0) {
        fVar29 = fVar20;
      }
      out_r[1].y = (float)(-(uint)(fVar20 < 0.0) & 0x3f800000 |
                          ~-(uint)(fVar20 < 0.0) & (uint)(1.0 - fVar29));
      uVar7 = CONCAT71((int7)(uVar7 >> 8),1);
    }
  }
  PopItemFlag();
  if ((uVar8 >> 8 & 1) == 0) {
    SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if ((-1 < (char)uVar8) && (text_end = FindRenderedTextEnd(label,(char *)0x0), text_end != label))
  {
    if ((uVar8 >> 8 & 1) != 0) {
      SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
    }
    TextEx(label,text_end,0);
  }
  if ((uVar8 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    current_off_unrotated = *out_r;
    if ((uVar8 & 2) == 0) {
      afStack_1d0[1] = out_r[1].y;
    }
    else {
      afStack_1d0[1] = 1.0;
    }
    __src = local_208;
    afStack_1d0[0] = out_r[1].x;
    if ((char)uVar8 < '\0') {
      Text("Current");
    }
    IVar15.x = local_138 * 3.0;
    IVar15.y = local_138 * 2.0;
    uStack_200._0_4_ = local_138 * 0.0;
    local_208._0_4_ = IVar15.x;
    local_208._4_4_ = IVar15.y;
    uStack_200._4_4_ = local_138 * 0.0;
    ColorButton("##current",(ImVec4 *)&current_off_unrotated,uVar8 & 0x180e0040,IVar15);
    if (__src != (undefined1  [8])0x0) {
      Text("Original");
      _uu = *(ImVec2 *)__src;
      if ((uVar8 & 2) == 0) {
        local_140.y = ((ImVec2 *)((long)__src + 8))->y;
      }
      else {
        local_140.y = 1.0;
      }
      local_140.x = ((ImVec2 *)((long)__src + 8))->x;
      bVar11 = ColorButton("##original",(ImVec4 *)&uu,uVar8 & 0x180e0040,(ImVec2)local_208);
      if (bVar11) {
        memcpy(out_r,(void *)__src,local_c8);
        uVar7 = CONCAT71((int7)(uVar7 >> 8),1);
      }
    }
    PopItemFlag();
    EndGroup();
  }
  fVar29 = local_138 * 0.2;
  fVar20 = 0.0;
  fVar31 = 0.0;
  fVar34 = 0.0;
  out_g = &out_r->y;
  local_188 = (char)uVar12;
  if (((char)local_220 != '\0') || (local_188 != '\0')) {
    if ((uVar8 >> 0x1b & 1) == 0) {
      if ((uVar8 >> 0x1c & 1) != 0) {
        out_r->x = local_22c;
        out_r->y = local_228;
        out_r[1].x = V;
      }
    }
    else {
      _local_208 = ZEXT416((uint)fVar29);
      ColorConvertHSVtoRGB
                ((float)(~-(uint)(1.0 <= local_22c) & (uint)local_22c |
                        (uint)(local_22c + -1e-05) & -(uint)(1.0 <= local_22c)),
                 (float)(~-(uint)(0.0 < local_228) & 0x3727c5ac |
                        (uint)local_228 & -(uint)(0.0 < local_228)),
                 (float)(~-(uint)(0.0 < V) & 0x358637bd | (uint)V & -(uint)(0.0 < V)),&out_r->x,
                 out_g,&out_r[1].x);
      fVar29 = (float)local_208._0_4_;
      fVar20 = (float)local_208._4_4_;
      fVar31 = (float)uStack_200;
      fVar34 = uStack_200._4_4_;
    }
  }
  iVar14 = (int)fVar29;
  iVar16 = (int)fVar20;
  iVar17 = (int)fVar31;
  iVar18 = (int)fVar34;
  if ((uVar8 & 0x20) == 0) {
    local_208._4_4_ = iVar16;
    local_208._0_4_ = iVar14;
    uStack_200._0_4_ = (float)iVar17;
    uStack_200._4_4_ = (float)iVar18;
    fVar29 = fVar13;
    if (local_19c != 0x10000) {
      fVar29 = (float)local_218._0_4_;
    }
    local_158 = (ImVec2)(out_r + 1);
    PushItemWidth((fVar29 + local_138) - local_68);
    uVar12 = uVar8 & 0x198e001a;
    cVar9 = '\x01';
    if (((uVar8 >> 0x14 & 1) != 0 || (uVar8 & 0x600000) == 0) &&
       (bVar11 = ColorEdit4("##rgb",&local_1f0->x,uVar12 | 0x100004), bVar11)) {
      uVar7 = CONCAT71((int7)(uVar7 >> 8),1);
      if (pIVar2->ActiveId == 0) {
        cVar9 = '\x01';
      }
      else {
        cVar9 = pIVar2->ActiveIdAllowOverlap;
      }
    }
    if ((uVar8 >> 0x15 & 1) == 0 && (uVar8 & 0x500000) != 0) {
      uVar7 = uVar7 & 0xffffffff;
    }
    else {
      bVar11 = ColorEdit4("##hsv",&local_1f0->x,uVar12 | 0x200004);
      uVar7 = CONCAT71((int7)((uVar7 & 0xffffffff) >> 8),(byte)(uVar7 & 0xffffffff) | bVar11);
    }
    if ((uVar8 >> 0x16 & 1) != 0 || (uVar8 & 0x300000) == 0) {
      bVar11 = ColorEdit4("##hex",&local_1f0->x,uVar12 | 0x400004);
      uVar7 = CONCAT71((int7)(uVar7 >> 8),(byte)uVar7 | bVar11);
    }
    PopItemWidth();
    out_r = local_1f0;
    if ((uVar8 >> 0x1b & 1) != 0 && cVar9 == '\0') {
      ColorConvertRGBtoHSV
                (local_1f0->x,local_1f0->y,local_1f0[1].x,&current_off_unrotated.x,&uu,&vv);
      if ((current_off_unrotated.x <= 0.0) && (0.0 < local_22c)) {
        if (0.0 < vv) {
LAB_0017c564:
          if (0.0 < uu) goto LAB_0017c587;
          fVar29 = local_228 * 0.5;
        }
        else {
          if ((V == vv) && (!NAN(V) && !NAN(vv))) goto LAB_0017c564;
          vv = V * 0.5;
          fVar29 = local_228;
        }
        ColorConvertHSVtoRGB(local_22c,fVar29,vv,&out_r->x,out_g,(float *)local_158);
      }
    }
LAB_0017c587:
    iVar14 = local_208._0_4_;
    iVar16 = local_208._4_4_;
    iVar17 = (int)(float)uStack_200;
    iVar18 = (int)uStack_200._4_4_;
  }
  else {
    uVar7 = uVar7 & 0xffffffff;
  }
  local_b8._4_4_ = (float)iVar16;
  local_b8._0_4_ = (float)iVar14;
  fStack_b0 = (float)iVar17;
  fStack_ac = (float)iVar18;
  if ((char)uVar7 != '\0') {
    if ((uVar8 >> 0x1b & 1) == 0) {
      if ((uVar8 >> 0x1c & 1) != 0) {
        local_22c = out_r->x;
        local_228 = out_r->y;
        V = out_r[1].x;
        ColorConvertHSVtoRGB(local_22c,local_228,V,&R,&G,&B);
      }
    }
    else {
      R = out_r->x;
      G = out_r->y;
      B = out_r[1].x;
      ColorConvertRGBtoHSV(R,G,B,&local_22c,&local_228,&V);
    }
  }
  current_off_unrotated.x = 1.0;
  current_off_unrotated.y = 1.0;
  afStack_1d0[0] = 1.0;
  afStack_1d0[1] = 1.0;
  ColorConvertHSVtoRGB
            (local_22c,1.0,1.0,(float *)&current_off_unrotated,&current_off_unrotated.y,afStack_1d0)
  ;
  col_upr_right = ColorConvertFloat4ToU32((ImVec4 *)&current_off_unrotated);
  fStack_144 = G;
  uu = R;
  local_140.y = 1.0;
  local_140.x = B;
  IVar5 = ColorConvertFloat4ToU32((ImVec4 *)&uu);
  pIVar3 = local_1c0;
  vv = 0.0;
  fStack_164 = 0.0;
  if ((uVar8 >> 0x1a & 1) == 0) {
    if ((uVar8 >> 0x19 & 1) != 0) {
      local_f8._0_4_ = IVar5;
      fStack_144 = local_e8 + fVar19;
      uu = local_78;
      ImDrawList::AddRectFilledMultiColor
                (local_1c0,&picker_pos,(ImVec2 *)&uu,0xffffffff,col_upr_right,col_upr_right,
                 0xffffffff);
      local_208._4_4_ = fVar19;
      local_208._0_4_ = fVar19;
      uStack_200._0_4_ = fVar19;
      uStack_200._4_4_ = fVar19;
      uu = picker_pos.x + fVar19;
      fStack_144 = picker_pos.y + fVar19;
      ImDrawList::AddRectFilledMultiColor
                (pIVar3,&picker_pos,(ImVec2 *)&uu,0,0,0xff000000,0xff000000);
      p_max.x = (float)local_208._0_4_ + picker_pos.x;
      p_max.y = (float)local_208._4_4_ + picker_pos.y;
      RenderFrameBorder(picker_pos,p_max,0.0);
      auVar30._4_4_ = 1.0 - V;
      auVar30._0_4_ = local_228;
      auVar30._8_8_ = 0;
      auVar32 = minps(_DAT_0018c870,auVar30);
      fVar29 = picker_pos.x;
      fVar20 = picker_pos.y;
      auVar33._0_4_ = (float)local_208._0_4_ + fVar29 + -2.0;
      auVar33._4_4_ = (float)local_208._4_4_ + fVar20 + -2.0;
      auVar33._8_4_ = (float)uStack_200 + 0.0 + 0.0;
      auVar33._12_4_ = uStack_200._4_4_ + 0.0 + 0.0;
      auVar24._0_4_ =
           (float)(int)((float)(-(uint)(0.0 <= local_228) & auVar32._0_4_) * (float)local_208._0_4_
                        + fVar29 + 0.5);
      auVar24._4_4_ =
           (float)(int)((float)(-(uint)(0.0 <= 1.0 - V) & auVar32._4_4_) * (float)local_208._4_4_ +
                        fVar20 + 0.5);
      auVar24._8_4_ = (float)(int)(auVar32._8_4_ * (float)uStack_200 + 0.0 + 0.0);
      auVar24._12_4_ = (float)(int)(auVar32._12_4_ * uStack_200._4_4_ + 0.0 + 0.0);
      auVar32 = minps(auVar33,auVar24);
      uVar8 = -(uint)(auVar24._0_4_ < fVar29 + 2.0);
      uVar12 = -(uint)(auVar24._4_4_ < fVar20 + 2.0);
      _vv = (ImVec2)(CONCAT44(~uVar12 & auVar32._4_4_,~uVar8 & auVar32._0_4_) |
                    CONCAT44((uint)(fVar20 + 2.0) & uVar12,(uint)(fVar29 + 2.0) & uVar8));
      local_208._4_4_ = uVar4;
      local_208._0_4_ = fVar19 / 6.0;
      uStack_200._0_4_ = (float)uVar27;
      uStack_200._4_4_ = (float)uVar28;
      lVar6 = 0;
      while( true ) {
        if (lVar6 == 6) break;
        fStack_144 = (float)(int)lVar6 * (float)local_208._0_4_ + picker_pos.y;
        uu = (float)local_218._0_4_;
        fStack_104 = (float)(int)(lVar6 + 1) * (float)local_208._0_4_ + picker_pos.y;
        ww = (float)local_1b8._0_4_;
        ImDrawList::AddRectFilledMultiColor
                  (local_1c0,(ImVec2 *)&uu,(ImVec2 *)&ww,(&DAT_001a0c50)[lVar6],
                   (&DAT_001a0c50)[lVar6],(&DAT_001a0c54)[lVar6],(&DAT_001a0c54)[lVar6]);
        lVar6 = lVar6 + 1;
      }
      _local_208 = ZEXT416((uint)(float)(int)(local_22c * fVar19 + picker_pos.y + 0.5));
      p_min.y = picker_pos.y;
      p_min.x = (float)local_218._0_4_;
      p_max_00.y = fVar19 + picker_pos.y;
      p_max_00.x = (float)local_1b8._0_4_;
      RenderFrameBorder(p_min,p_max_00,0.0);
      pos.x = (float)local_218._0_4_ + -1.0;
      pos.y = (float)local_208._0_4_;
      half_sz.x = (float)local_b8._0_4_ + 1.0;
      half_sz.y = (float)local_b8._0_4_;
      RenderArrowsForVerticalBar(local_1c0,pos,half_sz,local_138 + 2.0);
      out_r = local_1f0;
      IVar5 = local_f8._0_4_;
    }
  }
  else {
    local_f8._0_4_ = IVar5;
    local_88._0_4_ = (int)uVar7;
    _local_98 = ZEXT416((uint)(1.5 / (float)local_a8._0_4_));
    local_e8 = 5.60519e-45;
    if (4 < (int)(float)local_a8._0_4_ / 0xc) {
      local_e8 = (float)((int)(float)local_a8._0_4_ / 0xc);
    }
    local_68 = -(1.5 / (float)local_a8._0_4_);
    uStack_64 = 0x80000000;
    uStack_60 = 0x80000000;
    uStack_5c = 0x80000000;
    local_a8._0_4_ = (float)local_a8._0_4_ + (float)local_d8._0_4_;
    local_78 = (float)local_a8._0_4_ * 0.5;
    local_d8._4_4_ = local_d8._0_4_;
    fStack_d0 = (float)local_d8._0_4_;
    fStack_cc = (float)local_d8._0_4_;
    local_fc = col_upr_right;
    for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
      fVar29 = (float)(int)lVar6 / 6.0;
      fVar20 = (fVar29 + fVar29) * 3.1415927 + local_68;
      local_158.x = fVar20;
      fVar29 = ((float)(int)lVar6 + 1.0) / 6.0;
      fVar29 = (fVar29 + fVar29) * 3.1415927 + (float)local_98._0_4_;
      local_208._0_4_ = fVar29;
      iVar14 = (pIVar3->VtxBuffer).Size;
      ImDrawList::PathArcTo(pIVar3,&local_1a8,local_78,fVar20,fVar29,(int)local_e8);
      ImDrawList::PathStroke(pIVar3,0xffffffff,false,local_21c);
      iVar16 = (pIVar3->VtxBuffer).Size;
      _local_1b8 = ZEXT416((uint)local_1a8.x);
      local_218._0_4_ = cosf(local_158.x);
      local_218._4_4_ = extraout_XMM0_Db_02;
      fStack_210 = (float)extraout_XMM0_Dc_02;
      fStack_20c = (float)extraout_XMM0_Dd_02;
      auVar25._4_4_ = local_1a8.y;
      auVar25._0_4_ = local_1b8._0_4_;
      auVar25._8_4_ = local_1b8._4_4_;
      auVar25._12_4_ = 0;
      _local_1b8 = auVar25;
      fVar29 = sinf(local_158.x);
      fVar20 = (float)local_218._4_4_ * fStack_d0;
      local_218._4_4_ = fVar29 * (float)local_d8._4_4_ + (float)local_1b8._4_4_;
      local_218._0_4_ = (float)local_218._0_4_ * (float)local_d8._0_4_ + (float)local_1b8._0_4_;
      fStack_210 = fVar20 + fStack_1b0;
      fStack_20c = extraout_XMM0_Db_03 * fStack_cc + fStack_1ac;
      _local_1b8 = ZEXT416((uint)local_1a8.x);
      local_158.x = cosf((float)local_208._0_4_);
      local_158.y = extraout_XMM0_Db_04;
      uStack_150 = CONCAT44(extraout_XMM0_Dd_03,extraout_XMM0_Dc_03);
      auVar26._4_4_ = local_1a8.y;
      auVar26._0_4_ = local_1b8._0_4_;
      auVar26._8_4_ = local_1b8._4_4_;
      auVar26._12_4_ = 0;
      _local_1b8 = auVar26;
      fVar29 = sinf((float)local_208._0_4_);
      gradient_p1.x = local_158.x * (float)local_d8._0_4_ + (float)local_1b8._0_4_;
      gradient_p1.y = fVar29 * (float)local_d8._4_4_ + (float)local_1b8._4_4_;
      ShadeVertsLinearColorGradientKeepAlpha
                (pIVar3,iVar14,iVar16,(ImVec2)local_218,gradient_p1,(&DAT_001a0c50)[lVar6],
                 (&DAT_001a0c54)[lVar6]);
    }
    local_218._0_4_ = cosf((local_22c + local_22c) * 3.1415927);
    local_218._4_4_ = extraout_XMM0_Db_05;
    fStack_210 = (float)extraout_XMM0_Dc_04;
    fStack_20c = (float)extraout_XMM0_Dd_04;
    local_1b8._0_4_ = sinf((local_22c + local_22c) * 3.1415927);
    IVar5 = local_fc;
    pIVar3 = local_1c0;
    local_1b8._4_4_ = extraout_XMM0_Db_06;
    fStack_1b0 = (float)extraout_XMM0_Dc_05;
    fStack_1ac = (float)extraout_XMM0_Dd_05;
    uu = (float)local_218._0_4_ * (float)local_a8._0_4_ * 0.5 + local_1a8.x;
    fStack_144 = (float)local_1b8._0_4_ * (float)local_a8._0_4_ * 0.5 + local_1a8.y;
    if ((char)local_220 == '\0') {
      fVar29 = 0.55;
    }
    else {
      fVar29 = 0.65;
    }
    local_21c = local_21c * fVar29;
    iVar14 = 0x20;
    if ((int)(local_21c / 1.4) < 0x20) {
      iVar14 = (int)(local_21c / 1.4);
    }
    iVar16 = 9;
    if (9 < iVar14) {
      iVar16 = iVar14;
    }
    ImDrawList::AddCircleFilled(local_1c0,(ImVec2 *)&uu,local_21c,local_fc,iVar16);
    ImDrawList::AddCircle(pIVar3,(ImVec2 *)&uu,local_21c + 1.0,0xff808080,iVar16,1.0);
    ImDrawList::AddCircle(pIVar3,(ImVec2 *)&uu,local_21c,0xffffffff,iVar16,1.0);
    ww = triangle_pa.x * (float)local_218._0_4_ + -triangle_pa.y * (float)local_1b8._0_4_ +
         local_1a8.x;
    fStack_104 = triangle_pa.x * (float)local_1b8._0_4_ + triangle_pa.y * (float)local_218._0_4_ +
                 local_1a8.y;
    trb.x = local_160.x * (float)local_218._0_4_ + -local_160.y * (float)local_1b8._0_4_ +
            local_1a8.x;
    trb.y = local_160.x * (float)local_1b8._0_4_ + local_160.y * (float)local_218._0_4_ +
            local_1a8.y;
    trc.x = triangle_pc.x * (float)local_218._0_4_ + -triangle_pc.y * (float)local_1b8._0_4_ +
            local_1a8.x;
    trc.y = triangle_pc.x * (float)local_1b8._0_4_ + triangle_pc.y * (float)local_218._0_4_ +
            local_1a8.y;
    uv_white = GetFontTexUvWhitePixel();
    ImDrawList::PrimReserve(pIVar3,6,6);
    ImDrawList::PrimVtx(pIVar3,(ImVec2 *)&ww,&uv_white,IVar5);
    ImDrawList::PrimVtx(pIVar3,&trb,&uv_white,IVar5);
    ImDrawList::PrimVtx(pIVar3,&trc,&uv_white,0xffffffff);
    ImDrawList::PrimVtx(pIVar3,(ImVec2 *)&ww,&uv_white,0);
    ImDrawList::PrimVtx(pIVar3,&trb,&uv_white,0xff000000);
    ImDrawList::PrimVtx(pIVar3,&trc,&uv_white,0);
    ImDrawList::AddTriangle(pIVar3,(ImVec2 *)&ww,&trb,&trc,0xff808080,1.5);
    fVar29 = 1.0;
    if (local_228 <= 1.0) {
      fVar29 = local_228;
    }
    fVar29 = (float)(~-(uint)(local_228 < 0.0) & (uint)fVar29);
    fVar31 = 1.0 - V;
    fVar20 = 1.0;
    if (fVar31 <= 1.0) {
      fVar20 = fVar31;
    }
    fVar20 = (float)(~-(uint)(fVar31 < 0.0) & (uint)fVar20);
    fVar31 = fVar29 * (ww - trc.x) + trc.x;
    fVar29 = fVar29 * (ww._4_4_ - trc.y) + trc.y;
    vv = fVar20 * (trb.x - fVar31) + fVar31;
    fStack_164 = fVar20 * (trb.y - fVar29) + fVar29;
    uVar7 = (ulong)(uint)local_88._0_4_;
    out_r = local_1f0;
    IVar5 = local_f8._0_4_;
  }
  pIVar3 = local_1c0;
  if (local_188 == '\0') {
    fVar29 = 6.0;
  }
  else {
    fVar29 = 10.0;
  }
  local_218._0_4_ = fVar29;
  ImDrawList::AddCircleFilled(local_1c0,(ImVec2 *)&vv,fVar29,IVar5,0xc);
  ImDrawList::AddCircle(pIVar3,(ImVec2 *)&vv,(float)local_218._0_4_ + 1.0,0xff808080,0xc,1.0);
  ImDrawList::AddCircle(pIVar3,(ImVec2 *)&vv,(float)local_218._0_4_,0xffffffff,0xc,1.0);
  if (local_19c == 0x10000) {
    fVar29 = out_r[1].y;
    _local_1b8 = ZEXT416((uint)fVar29);
    fVar20 = 1.0;
    if (fVar29 <= 1.0) {
      fVar20 = fVar29;
    }
    _local_218 = ZEXT416((uint)(1.0 - fVar20));
    fStack_144 = picker_pos.y;
    uu = fVar13;
    local_140.x = fVar13 + local_138;
    local_140.y = picker_pos.y + fVar19;
    RenderColorRectWithAlphaCheckerboard
              (_uu,local_140,0,(local_140.x - fVar13) * 0.5,(ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (pIVar3,(ImVec2 *)&uu,&local_140,IVar5,IVar5,IVar5 & 0xffffff,IVar5 & 0xffffff);
    local_218._4_4_ = (float)(int)(float)(~local_1b8._4_4_ & local_218._4_4_);
    local_218._0_4_ =
         (float)(int)((float)(-(uint)((float)local_1b8._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_1b8._0_4_ < 0.0) & local_218._0_4_) * fVar19 +
                      picker_pos.y + 0.5);
    fStack_210 = (float)(int)(float)(~(uint)fStack_1b0 & (uint)fStack_210);
    fStack_20c = (float)(int)(float)(~(uint)fStack_1ac & (uint)fStack_20c);
    RenderFrameBorder(_uu,local_140,0.0);
    pos_00.x = fVar13 + -1.0;
    pos_00.y = (float)local_218._0_4_;
    half_sz_00.x = (float)local_b8._0_4_ + 1.0;
    half_sz_00.y = (float)local_b8._0_4_;
    RenderArrowsForVerticalBar(pIVar3,pos_00,half_sz_00,local_138 + 2.0);
  }
  EndGroup();
  pIVar1 = local_c0;
  if ((char)uVar7 != '\0') {
    iVar14 = bcmp(backup_initial_col,out_r,local_c8);
    uVar7 = uVar7 & 0xff;
    if (iVar14 == 0) {
      uVar7 = 0;
    }
  }
  bVar10 = (byte)uVar7;
  if ((uVar7 & 1) != 0) {
    MarkItemEdited((pIVar1->DC).LastItemId);
  }
  PopID();
LAB_0017d0bf:
  return (bool)(bVar10 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__InputMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = (float)(int)(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
    else if (flags & ImGuiColorEditFlags_InputHSV)
        ColorConvertHSVtoRGB(H, S, V, R, G, B);

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differenciating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    ImVec4 hue_color_f(1, 1, 1, 1); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 col32_no_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, 1.0f));

    const ImU32 hue_colors[6+1] = { IM_COL32(255,0,0,255), IM_COL32(255,255,0,255), IM_COL32(0,255,0,255), IM_COL32(0,255,255,255), IM_COL32(0,0,255,255), IM_COL32(255,0,255,255), IM_COL32(255,0,0,255) };
    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 1.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(IM_COL32_WHITE, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, hue_colors[n], hue_colors[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, IM_COL32(128,128,128,255), hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, IM_COL32_WHITE, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_WHITE);
        draw_list->PrimVtx(tra, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->PrimVtx(trb, uv_white, IM_COL32_BLACK);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->AddTriangle(tra, trb, trc, IM_COL32(128,128,128,255), 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_WHITE, hue_color32, hue_color32, IM_COL32_WHITE);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_BLACK_TRANS, IM_COL32_BLACK_TRANS, IM_COL32_BLACK, IM_COL32_BLACK);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp((float)(int)(picker_pos.x + ImSaturate(S)     * sv_picker_size + 0.5f), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp((float)(int)(picker_pos.y + ImSaturate(1 - V) * sv_picker_size + 0.5f), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), hue_colors[i], hue_colors[i], hue_colors[i + 1], hue_colors[i + 1]);
        float bar0_line_y = (float)(int)(picker_pos.y + H * sv_picker_size + 0.5f);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, col32_no_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, IM_COL32(128,128,128,255), 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, IM_COL32_WHITE, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(bar1_bb.Min, bar1_bb.Max, IM_COL32(0,0,0,0), bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, col32_no_alpha, col32_no_alpha, col32_no_alpha & ~IM_COL32_A_MASK, col32_no_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = (float)(int)(picker_pos.y + (1.0f - alpha) * sv_picker_size + 0.5f);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}